

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::ShadeVertsLinearAlphaGradientForLeftToRightText
               (ImDrawVert *vert_start,ImDrawVert *vert_end,float gradient_p0_x,float gradient_p1_x)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ImDrawVert *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = gradient_p1_x - gradient_p0_x;
  pIVar4 = vert_end + -1;
  iVar2 = 0;
  do {
    if (pIVar4 < vert_start) {
      return;
    }
    fVar6 = ((pIVar4->pos).x - gradient_p0_x) * fVar5 * (1.0 / (fVar5 * fVar5));
    fVar7 = 1.0;
    if (fVar6 <= 1.0) {
      fVar7 = fVar6;
    }
    fVar7 = (float)(-(uint)(fVar6 < 0.0) & 0x3f800000 | ~-(uint)(fVar6 < 0.0) & (uint)(1.0 - fVar7))
    ;
    iVar3 = iVar2;
    if ((fVar7 < 1.0) || (iVar3 = iVar2 + 1, iVar2 < 2)) {
      *(char *)((long)&pIVar4->col + 3) =
           (char)(int)((float)*(byte *)((long)&pIVar4->col + 3) * fVar7);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    pIVar4 = pIVar4 + -1;
    iVar2 = iVar3;
  } while (bVar1);
  return;
}

Assistant:

void ImGui::ShadeVertsLinearAlphaGradientForLeftToRightText(ImDrawVert* vert_start, ImDrawVert* vert_end, float gradient_p0_x, float gradient_p1_x)
{
    float gradient_extent_x = gradient_p1_x - gradient_p0_x;
    float gradient_inv_length2 = 1.0f / (gradient_extent_x * gradient_extent_x);
    int full_alpha_count = 0;
    for (ImDrawVert* vert = vert_end - 1; vert >= vert_start; vert--)
    {
        float d = (vert->pos.x - gradient_p0_x) * (gradient_extent_x);
        float alpha_mul = 1.0f - ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        if (alpha_mul >= 1.0f && ++full_alpha_count > 2)
            return; // Early out
        int a = (int)(((vert->col >> IM_COL32_A_SHIFT) & 0xFF) * alpha_mul);
        vert->col = (vert->col & ~IM_COL32_A_MASK) | (a << IM_COL32_A_SHIFT);
    }
}